

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  long lVar1;
  ucvector *puVar2;
  uint uVar3;
  uint extraout_EAX;
  uchar *in_RAX;
  uchar *puVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong __size;
  uchar *data;
  uchar uVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  ucvector compressed;
  uchar *local_78;
  size_t asStack_70 [3];
  ulong local_58;
  uchar *local_50;
  char *local_48;
  ucvector *local_40;
  LodePNGCompressSettings *local_38;
  
  sVar9 = 0xffffffffffffffff;
  do {
    lVar1 = sVar9 + 1;
    sVar9 = sVar9 + 1;
  } while (textstring[lVar1] != '\0');
  local_78 = (uchar *)0x0;
  asStack_70[0] = 0;
  asStack_70[1] = 0;
  uVar8 = *keyword;
  local_50 = (uchar *)textstring;
  local_40 = out;
  if (uVar8 == '\0') {
    uVar3 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    data = (uchar *)0x0;
    uVar5 = 0;
    sVar6 = 0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    sVar6 = 0;
    uVar5 = 0;
    data = (uchar *)0x0;
    local_48 = keyword;
    local_38 = zlibsettings;
    do {
      uVar7 = uVar5 + 1;
      if (sVar6 < uVar7) {
        __size = uVar7 * 3 >> 1;
        if (sVar6 * 2 < uVar7) {
          __size = uVar7;
        }
        local_58 = sVar6;
        in_RAX = (uchar *)realloc(data,__size);
        bVar11 = in_RAX == (uchar *)0x0;
        sVar6 = local_58;
        keyword = local_48;
        if (!bVar11) {
          uVar5 = uVar7;
          sVar6 = __size;
          data = in_RAX;
        }
      }
      else {
        bVar11 = false;
        uVar5 = uVar7;
      }
      if (!bVar11) {
        data[uVar5 - 1] = uVar8;
      }
      uVar8 = keyword[uVar10 + 2];
      uVar10 = uVar10 + 1;
    } while (uVar8 != '\0');
    uVar3 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),0x4e < uVar10);
    zlibsettings = local_38;
  }
  if ((char)uVar3 == '\0') {
    uVar10 = uVar5 + 1;
    if (sVar6 < uVar10) {
      uVar7 = uVar10 * 3 >> 1;
      if (sVar6 * 2 < uVar10) {
        uVar7 = uVar10;
      }
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar10 = uVar5;
      }
      else {
        bVar11 = false;
        sVar6 = uVar7;
        data = puVar4;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar10 - 1] = '\0';
    }
    uVar5 = uVar10 + 1;
    if (sVar6 < uVar5) {
      uVar7 = uVar5 * 3 >> 1;
      if (sVar6 * 2 < uVar5) {
        uVar7 = uVar5;
      }
      local_58 = sVar6;
      puVar4 = (uchar *)realloc(data,uVar7);
      if (puVar4 == (uchar *)0x0) {
        bVar11 = true;
        uVar5 = uVar10;
        sVar6 = local_58;
      }
      else {
        bVar11 = false;
        sVar6 = uVar7;
        data = puVar4;
      }
    }
    else {
      bVar11 = false;
    }
    if (!bVar11) {
      data[uVar5 - 1] = '\0';
    }
    if (zlibsettings->custom_zlib ==
        (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0) {
      uVar3 = lodepng_zlib_compress(&local_78,asStack_70,local_50,sVar9,zlibsettings);
    }
    else {
      uVar3 = (*zlibsettings->custom_zlib)(&local_78,asStack_70,local_50,sVar9,zlibsettings);
    }
    if (uVar3 == 0) {
      if (asStack_70[0] != 0) {
        sVar9 = 0;
        uVar10 = uVar5;
        do {
          uVar8 = local_78[sVar9];
          uVar5 = uVar10 + 1;
          if (sVar6 < uVar5) {
            uVar7 = uVar5 * 3 >> 1;
            if (sVar6 * 2 < uVar5) {
              uVar7 = uVar5;
            }
            puVar4 = (uchar *)realloc(data,uVar7);
            if (puVar4 == (uchar *)0x0) {
              bVar11 = true;
              uVar5 = uVar10;
            }
            else {
              bVar11 = false;
              sVar6 = uVar7;
              data = puVar4;
            }
          }
          else {
            bVar11 = false;
          }
          if (!bVar11) {
            data[uVar5 - 1] = uVar8;
          }
          sVar9 = sVar9 + 1;
          uVar10 = uVar5;
        } while (sVar9 != asStack_70[0]);
      }
      puVar2 = local_40;
      uVar3 = lodepng_chunk_create(&local_40->data,&local_40->size,(uint)uVar5,"zTXt",data);
      if (uVar3 == 0) {
        puVar2->allocsize = puVar2->size;
      }
    }
    asStack_70[0] = 0;
    asStack_70[1] = 0;
    free(local_78);
    local_78 = (uchar *)0x0;
    free(data);
    uVar3 = extraout_EAX;
  }
  return uVar3;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  ucvector data, compressed;
  size_t i, textsize = lodepng_strlen(textstring);

  ucvector_init(&data);
  ucvector_init(&compressed);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*0 termination char*/
  ucvector_push_back(&data, 0); /*compression method: 0*/

  error = zlib_compress(&compressed.data, &compressed.size,
                        (const unsigned char*)textstring, textsize, zlibsettings);
  if(!error) {
    for(i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
    error = addChunk(out, "zTXt", data.data, data.size);
  }

  ucvector_cleanup(&compressed);
  ucvector_cleanup(&data);
  return error;
}